

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxVisitor.cpp
# Opt level: O3

SyntaxNode * __thiscall
anon_unknown.dwarf_18c4e49::CloneVisitor::visit<slang::syntax::SequenceMatchListSyntax>
          (CloneVisitor *this,SequenceMatchListSyntax *node)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  byte bVar3;
  ChangeCollection *pCVar4;
  value_type_pointer ppVar5;
  undefined1 auVar6 [16];
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  byte bVar10;
  TokenOrSyntax child;
  TokenOrSyntax child_00;
  int iVar11;
  undefined4 extraout_var;
  size_t sVar12;
  SyntaxNode *node_00;
  ulong uVar13;
  long lVar14;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *p_Var15;
  logic_error *plVar16;
  void *in_RCX;
  int in_EDX;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  ulong index;
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> _Var24;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> listBuffer;
  uint7 uStack_19f;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_198;
  char local_188;
  SyntaxNode *local_180;
  undefined8 uStack_178;
  undefined1 local_170;
  undefined7 uStack_16f;
  uchar local_168;
  uchar uStack_167;
  uchar uStack_166;
  byte bStack_165;
  uchar uStack_164;
  uchar uStack_163;
  uchar uStack_162;
  byte bStack_161;
  uchar uStack_160;
  uchar uStack_15f;
  uchar uStack_15e;
  byte bStack_15d;
  uchar uStack_15c;
  uchar uStack_15b;
  uchar uStack_15a;
  byte bStack_159;
  uchar local_158;
  uchar uStack_157;
  uchar uStack_156;
  byte bStack_155;
  uchar uStack_154;
  uchar uStack_153;
  uchar uStack_152;
  byte bStack_151;
  uchar uStack_150;
  uchar uStack_14f;
  uchar uStack_14e;
  byte bStack_14d;
  uchar uStack_14c;
  uchar uStack_14b;
  uchar uStack_14a;
  byte bStack_149;
  uchar local_148;
  uchar uStack_147;
  uchar uStack_146;
  byte bStack_145;
  uchar uStack_144;
  uchar uStack_143;
  uchar uStack_142;
  byte bStack_141;
  uchar uStack_140;
  uchar uStack_13f;
  uchar uStack_13e;
  byte bStack_13d;
  uchar uStack_13c;
  uchar uStack_13b;
  uchar uStack_13a;
  byte bStack_139;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_138;
  undefined1 auStack_128 [8];
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_120;
  undefined1 *local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined1 local_f0 [192];
  SequenceMatchListSyntax *this_00;
  
  iVar11 = slang::syntax::clone((__fn *)node,this->alloc,in_EDX,in_RCX);
  this_00 = (SequenceMatchListSyntax *)CONCAT44(extraout_var,iVar11);
  local_108 = local_f0;
  local_100 = 0;
  local_f8 = 8;
  index = 0;
  do {
    sVar12 = slang::syntax::SyntaxNode::getChildCount(&node->super_SyntaxNode);
    if (sVar12 <= index) {
      if (local_108 != local_f0) {
        operator_delete(local_108);
      }
      return &this_00->super_SyntaxNode;
    }
    node_00 = slang::syntax::SyntaxNode::childNode(&node->super_SyntaxNode,index);
    if (node_00 == (SyntaxNode *)0x0) {
      slang::syntax::SequenceMatchListSyntax::getChild
                ((ConstTokenOrSyntax *)&local_198._M_first,node,index);
      if (local_188 == '\0') {
        local_198._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             slang::syntax::SyntaxNode::childToken(&node->super_SyntaxNode,index);
        _Var24._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             slang::parsing::Token::deepClone(&local_198._M_first._M_storage,this->alloc);
        child_00.super_ConstTokenOrSyntax.
        super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        _16_8_ = (ulong)uStack_19f << 8;
        child_00.super_ConstTokenOrSyntax.
        super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>._M_u.
        _M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             (_Uninitialized<slang::parsing::Token,_true>)_Var24;
        slang::syntax::SequenceMatchListSyntax::setChild(this_00,index,child_00);
      }
    }
    else {
      pCVar4 = this->commits;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = node_00;
      uVar20 = SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),8) ^
               SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),0);
      uVar13 = uVar20 >> ((byte)(pCVar4->insertBefore).table_.
                                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::vector<slang::syntax::detail::SyntaxChange>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange>_>_>_>
                                .arrays.groups_size_index & 0x3f);
      lVar14 = (uVar20 & 0xff) * 4;
      uVar7 = (&UNK_0092f4ac)[lVar14];
      uVar8 = (&UNK_0092f4ad)[lVar14];
      uVar9 = (&UNK_0092f4ae)[lVar14];
      bVar10 = (&UNK_0092f4af)[lVar14];
      uVar17 = 0;
      do {
        pgVar1 = (pCVar4->insertBefore).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::vector<slang::syntax::detail::SyntaxChange>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange>_>_>_>
                 .arrays.groups_ + uVar13;
        local_148 = pgVar1->m[0].n;
        uStack_147 = pgVar1->m[1].n;
        uStack_146 = pgVar1->m[2].n;
        bStack_145 = pgVar1->m[3].n;
        uStack_144 = pgVar1->m[4].n;
        uStack_143 = pgVar1->m[5].n;
        uStack_142 = pgVar1->m[6].n;
        bStack_141 = pgVar1->m[7].n;
        uStack_140 = pgVar1->m[8].n;
        uStack_13f = pgVar1->m[9].n;
        uStack_13e = pgVar1->m[10].n;
        bStack_13d = pgVar1->m[0xb].n;
        uStack_13c = pgVar1->m[0xc].n;
        uStack_13b = pgVar1->m[0xd].n;
        uStack_13a = pgVar1->m[0xe].n;
        bStack_139 = pgVar1->m[0xf].n;
        auVar21[0] = -(local_148 == uVar7);
        auVar21[1] = -(uStack_147 == uVar8);
        auVar21[2] = -(uStack_146 == uVar9);
        auVar21[3] = -(bStack_145 == bVar10);
        auVar21[4] = -(uStack_144 == uVar7);
        auVar21[5] = -(uStack_143 == uVar8);
        auVar21[6] = -(uStack_142 == uVar9);
        auVar21[7] = -(bStack_141 == bVar10);
        auVar21[8] = -(uStack_140 == uVar7);
        auVar21[9] = -(uStack_13f == uVar8);
        auVar21[10] = -(uStack_13e == uVar9);
        auVar21[0xb] = -(bStack_13d == bVar10);
        auVar21[0xc] = -(uStack_13c == uVar7);
        auVar21[0xd] = -(uStack_13b == uVar8);
        auVar21[0xe] = -(uStack_13a == uVar9);
        auVar21[0xf] = -(bStack_139 == bVar10);
        uVar19 = (uint)(ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe);
        if (uVar19 != 0) {
          do {
            iVar11 = 0;
            if (uVar19 != 0) {
              for (; (uVar19 >> iVar11 & 1) == 0; iVar11 = iVar11 + 1) {
              }
            }
            if (node_00 ==
                *(SyntaxNode **)
                 ((long)&(pCVar4->insertBefore).table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::vector<slang::syntax::detail::SyntaxChange>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange>_>_>_>
                         .arrays.elements_[uVar13 * 0xf].first + (ulong)(uint)(iVar11 << 5))) {
              plVar16 = (logic_error *)__cxa_allocate_exception(0x10);
              std::logic_error::logic_error
                        (plVar16,"Can\'t use insertBefore or insertAfter on a non-list node");
              __cxa_throw(plVar16,&std::logic_error::typeinfo,std::logic_error::~logic_error);
            }
            uVar19 = uVar19 - 1 & uVar19;
          } while (uVar19 != 0);
        }
        bVar3 = (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::
                  is_not_overflowed(unsigned_long)::shift)[(uint)uVar20 & 7];
        if ((bVar3 & bStack_139) == 0) break;
        uVar18 = (pCVar4->insertBefore).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::vector<slang::syntax::detail::SyntaxChange>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange>_>_>_>
                 .arrays.groups_size_mask;
        lVar14 = uVar13 + uVar17;
        uVar17 = uVar17 + 1;
        uVar13 = lVar14 + 1U & uVar18;
      } while (uVar17 <= uVar18);
      uVar13 = uVar20 >> ((byte)(pCVar4->removeOrReplace).table_.
                                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>_>_>
                                .arrays.groups_size_index & 0x3f);
      uVar17 = 0;
      do {
        pgVar2 = (pCVar4->removeOrReplace).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>_>_>
                 .arrays.groups_ + uVar13;
        local_158 = pgVar2->m[0].n;
        uStack_157 = pgVar2->m[1].n;
        uStack_156 = pgVar2->m[2].n;
        bStack_155 = pgVar2->m[3].n;
        uStack_154 = pgVar2->m[4].n;
        uStack_153 = pgVar2->m[5].n;
        uStack_152 = pgVar2->m[6].n;
        bStack_151 = pgVar2->m[7].n;
        uStack_150 = pgVar2->m[8].n;
        uStack_14f = pgVar2->m[9].n;
        uStack_14e = pgVar2->m[10].n;
        bStack_14d = pgVar2->m[0xb].n;
        uStack_14c = pgVar2->m[0xc].n;
        uStack_14b = pgVar2->m[0xd].n;
        uStack_14a = pgVar2->m[0xe].n;
        bStack_149 = pgVar2->m[0xf].n;
        auVar22[0] = -(local_158 == uVar7);
        auVar22[1] = -(uStack_157 == uVar8);
        auVar22[2] = -(uStack_156 == uVar9);
        auVar22[3] = -(bStack_155 == bVar10);
        auVar22[4] = -(uStack_154 == uVar7);
        auVar22[5] = -(uStack_153 == uVar8);
        auVar22[6] = -(uStack_152 == uVar9);
        auVar22[7] = -(bStack_151 == bVar10);
        auVar22[8] = -(uStack_150 == uVar7);
        auVar22[9] = -(uStack_14f == uVar8);
        auVar22[10] = -(uStack_14e == uVar9);
        auVar22[0xb] = -(bStack_14d == bVar10);
        auVar22[0xc] = -(uStack_14c == uVar7);
        auVar22[0xd] = -(uStack_14b == uVar8);
        auVar22[0xe] = -(uStack_14a == uVar9);
        auVar22[0xf] = -(bStack_149 == bVar10);
        uVar19 = (uint)(ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe);
        if (uVar19 != 0) {
          ppVar5 = (pCVar4->removeOrReplace).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>_>_>
                   .arrays.elements_;
          do {
            iVar11 = 0;
            if (uVar19 != 0) {
              for (; (uVar19 >> iVar11 & 1) == 0; iVar11 = iVar11 + 1) {
              }
            }
            uVar18 = (ulong)(uint)(iVar11 * 0x30);
            if (node_00 == *(SyntaxNode **)((long)&ppVar5[uVar13 * 0xf].first + uVar18)) {
              if (*(char *)((long)&ppVar5[uVar13 * 0xf].second.
                                   super__Variant_base<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>
                                   .
                                   super__Move_assign_alias<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>
                                   .
                                   super__Copy_assign_alias<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>
                                   .
                                   super__Move_ctor_alias<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>
                                   .
                                   super__Copy_ctor_alias<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>
                                   .
                                   super__Variant_storage_alias<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>
                           + uVar18 + 0x20) == '\x01') {
                local_120._M_rest =
                     *(_Variadic_union<const_slang::syntax::SyntaxNode_*> *)
                      ((long)&ppVar5[uVar13 * 0xf].second.
                              super__Variant_base<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>
                              .
                              super__Move_assign_alias<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>
                              .
                              super__Copy_assign_alias<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>
                              .
                              super__Move_ctor_alias<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>
                              .
                              super__Copy_ctor_alias<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>
                              .
                              super__Variant_storage_alias<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>
                      + uVar18 + 8);
                p_Var15 = &local_120;
              }
              else {
                local_138._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)0x0;
                p_Var15 = &local_138;
              }
              *(undefined1 *)&(&p_Var15->_M_first)[1]._M_storage.kind = EndOfFile;
              slang::syntax::SequenceMatchListSyntax::setChild
                        (this_00,index,
                         (ConstTokenOrSyntax)*(ConstTokenOrSyntax *)&(p_Var15->_M_first)._M_storage)
              ;
              goto LAB_006f5443;
            }
            uVar19 = uVar19 - 1 & uVar19;
          } while (uVar19 != 0);
        }
        if ((bVar3 & bStack_149) == 0) break;
        uVar18 = (pCVar4->removeOrReplace).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>_>_>
                 .arrays.groups_size_mask;
        lVar14 = uVar13 + uVar17;
        uVar17 = uVar17 + 1;
        uVar13 = lVar14 + 1U & uVar18;
      } while (uVar17 <= uVar18);
      local_180 = slang::syntax::detail::
                  visitSyntaxNode<slang::syntax::SyntaxNode_const,(anonymous_namespace)::CloneVisitor>
                            (node_00,this);
      local_170 = 1;
      child.super_ConstTokenOrSyntax.
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>._17_7_
           = uStack_16f;
      child.super_ConstTokenOrSyntax.
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      _M_index = 1;
      child.super_ConstTokenOrSyntax.
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>._M_u.
      _M_first._M_storage.info = (Info *)uStack_178;
      child.super_ConstTokenOrSyntax.
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>._M_u.
      _M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)local_180;
      slang::syntax::SequenceMatchListSyntax::setChild(this_00,index,child);
LAB_006f5443:
      pCVar4 = this->commits;
      uVar20 = uVar20 >> ((byte)(pCVar4->insertAfter).table_.
                                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::vector<slang::syntax::detail::SyntaxChange>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange>_>_>_>
                                .arrays.groups_size_index & 0x3f);
      uVar13 = 0;
      do {
        pgVar1 = (pCVar4->insertAfter).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::vector<slang::syntax::detail::SyntaxChange>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange>_>_>_>
                 .arrays.groups_ + uVar20;
        local_168 = pgVar1->m[0].n;
        uStack_167 = pgVar1->m[1].n;
        uStack_166 = pgVar1->m[2].n;
        bStack_165 = pgVar1->m[3].n;
        uStack_164 = pgVar1->m[4].n;
        uStack_163 = pgVar1->m[5].n;
        uStack_162 = pgVar1->m[6].n;
        bStack_161 = pgVar1->m[7].n;
        uStack_160 = pgVar1->m[8].n;
        uStack_15f = pgVar1->m[9].n;
        uStack_15e = pgVar1->m[10].n;
        bStack_15d = pgVar1->m[0xb].n;
        uStack_15c = pgVar1->m[0xc].n;
        uStack_15b = pgVar1->m[0xd].n;
        uStack_15a = pgVar1->m[0xe].n;
        bStack_159 = pgVar1->m[0xf].n;
        auVar23[0] = -(local_168 == uVar7);
        auVar23[1] = -(uStack_167 == uVar8);
        auVar23[2] = -(uStack_166 == uVar9);
        auVar23[3] = -(bStack_165 == bVar10);
        auVar23[4] = -(uStack_164 == uVar7);
        auVar23[5] = -(uStack_163 == uVar8);
        auVar23[6] = -(uStack_162 == uVar9);
        auVar23[7] = -(bStack_161 == bVar10);
        auVar23[8] = -(uStack_160 == uVar7);
        auVar23[9] = -(uStack_15f == uVar8);
        auVar23[10] = -(uStack_15e == uVar9);
        auVar23[0xb] = -(bStack_15d == bVar10);
        auVar23[0xc] = -(uStack_15c == uVar7);
        auVar23[0xd] = -(uStack_15b == uVar8);
        auVar23[0xe] = -(uStack_15a == uVar9);
        auVar23[0xf] = -(bStack_159 == bVar10);
        uVar19 = (uint)(ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe);
        if (uVar19 != 0) {
          do {
            iVar11 = 0;
            if (uVar19 != 0) {
              for (; (uVar19 >> iVar11 & 1) == 0; iVar11 = iVar11 + 1) {
              }
            }
            if (node_00 ==
                *(SyntaxNode **)
                 ((long)&(pCVar4->insertAfter).table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::vector<slang::syntax::detail::SyntaxChange>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange>_>_>_>
                         .arrays.elements_[uVar20 * 0xf].first + (ulong)(uint)(iVar11 << 5))) {
              plVar16 = (logic_error *)__cxa_allocate_exception(0x10);
              std::logic_error::logic_error
                        (plVar16,"Can\'t use insertBefore or insertAfter on a non-list node");
              __cxa_throw(plVar16,&std::logic_error::typeinfo,std::logic_error::~logic_error);
            }
            uVar19 = uVar19 - 1 & uVar19;
          } while (uVar19 != 0);
        }
        if ((bVar3 & bStack_159) == 0) break;
        uVar17 = (pCVar4->insertAfter).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::vector<slang::syntax::detail::SyntaxChange>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange>_>_>_>
                 .arrays.groups_size_mask;
        lVar14 = uVar20 + uVar13;
        uVar13 = uVar13 + 1;
        uVar20 = lVar14 + 1U & uVar17;
      } while (uVar13 <= uVar17);
    }
    index = index + 1;
  } while( true );
}

Assistant:

SyntaxNode* visit(const T& node) {
        T* cloned = clone(node, alloc);

        constexpr bool IsList = std::is_same_v<T, SyntaxListBase>;
        SmallVector<TokenOrSyntax, 8> listBuffer;
        bool skipSeparator = false;

        if constexpr (IsList) {
            if (auto it = commits.listInsertAtFront.find(&node);
                it != commits.listInsertAtFront.end()) {

                const SyntaxChange* lastChange = nullptr;
                for (const auto& change : it->second) {
                    if (!listBuffer.empty() && change.separator)
                        listBuffer.push_back(change.separator);
                    listBuffer.push_back(change.second);
                    lastChange = &change;
                }

                if (lastChange && node.getChildCount() && lastChange->separator)
                    listBuffer.push_back(lastChange->separator);
            }
        }

        for (size_t i = 0; i < node.getChildCount(); i++) {
            auto child = node.childNode(i);
            if (!child) {
                if constexpr (IsList) {
                    if (!skipSeparator)
                        listBuffer.push_back(node.childToken(i).deepClone(alloc));
                    skipSeparator = false;
                }
                else {
                    if (node.getChild(i).isToken()) { // check since it might be null node
                        cloned->setChild(i, node.childToken(i).deepClone(alloc));
                    }
                }
                continue;
            }

            if (auto it = commits.insertBefore.find(child); it != commits.insertBefore.end()) {
                if (!IsList) {
                    SLANG_THROW(std::logic_error(
                        "Can't use insertBefore or insertAfter on a non-list node"));
                }

                for (const auto& change : it->second)
                    listBuffer.push_back(change.second);
            }

            if (auto it = commits.removeOrReplace.find(child);
                it != commits.removeOrReplace.end()) {
                if (auto replaceChange = std::get_if<ReplaceChange>(&it->second)) {
                    if constexpr (IsList)
                        listBuffer.push_back(replaceChange->second);
                    else
                        cloned->setChild(i, replaceChange->second);
                }
                else {
                    if constexpr (!IsList) {
                        static SyntaxNode* emptyNode = nullptr;
                        cloned->setChild(i, emptyNode);
                    }
                    else {
                        skipSeparator = true; // remove separator related to removed node
                    }
                }
            }
            else {
                if constexpr (IsList) {
                    listBuffer.push_back(child->visit(*this));
                }
                else {
                    cloned->setChild(i, child->visit(*this));
                }
            }

            if (auto it = commits.insertAfter.find(child); it != commits.insertAfter.end()) {
                if (!IsList) {
                    SLANG_THROW(std::logic_error(
                        "Can't use insertBefore or insertAfter on a non-list node"));
                }

                for (const auto& change : it->second)
                    listBuffer.push_back(change.second);
            }
        }

        if constexpr (IsList) {
            if (skipSeparator) {
                // remove trailing sep if it wasn't there before transform
                bool isClonedTrailing = !listBuffer.empty() && listBuffer.back().isToken();
                bool isOriginalTrailing = node.getChildCount() &&
                                          node.getChild(node.getChildCount() - 1).isToken();
                if (isClonedTrailing && !isOriginalTrailing)
                    listBuffer.pop_back();
            }
            if (auto it = commits.listInsertAtBack.find(&node);
                it != commits.listInsertAtBack.end()) {

                for (const auto& change : it->second) {
                    if (!listBuffer.empty() && change.separator)
                        listBuffer.push_back(change.separator);
                    listBuffer.push_back(change.second);
                }
            }

            cloned->resetAll(alloc, listBuffer);
        }

        return cloned;
    }